

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_hand.cc
# Opt level: O3

string * __thiscall
hanabi_learning_env::HanabiHand::CardKnowledge::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CardKnowledge *this)

{
  int iVar1;
  long *plVar2;
  _Bit_type *p_Var3;
  long *plVar4;
  _Bit_type *p_Var5;
  uint uVar6;
  size_type sVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 *local_90;
  ulong local_88;
  undefined1 local_80 [16];
  long *local_70;
  ulong local_68;
  long local_60;
  long lStack_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  paVar8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  iVar1 = (this->color_).value_;
  if (iVar1 < 0) {
    sVar7 = 0;
  }
  else {
    ColorIndexToChar(iVar1);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(__return_storage_ptr__->_M_dataplus)._M_p;
    sVar7 = __return_storage_ptr__->_M_string_length;
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,paVar8,sVar7 + (long)paVar8);
  std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  iVar1 = (this->rank_).value_;
  if (-1 < iVar1) {
    RankIndexToChar(iVar1);
  }
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_60 = *plVar4;
    lStack_58 = plVar2[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar4;
    local_70 = (long *)*plVar2;
  }
  local_68 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_70,local_68,0,'\x01');
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_40 = *plVar4;
    lStack_38 = plVar2[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar4;
    local_50 = (long *)*plVar2;
  }
  local_48 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  p_Var3 = (this->color_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  p_Var5 = (this->color_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar6 = *(uint *)((long)&(this->color_).value_plausible_.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
  if (0 < (int)(uVar6 + ((int)p_Var5 - (int)p_Var3) * 8)) {
    uVar10 = 0;
    do {
      if ((p_Var3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
        ColorIndexToChar((int)uVar10);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        p_Var3 = (this->color_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        p_Var5 = (this->color_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        uVar6 = *(uint *)((long)&(this->color_).value_plausible_.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while ((int)uVar9 < (int)(uVar6 + ((int)p_Var5 - (int)p_Var3) * 8));
  }
  p_Var3 = (this->rank_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  p_Var5 = (this->rank_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar6 = *(uint *)((long)&(this->rank_).value_plausible_.super__Bvector_base<std::allocator<bool>_>
                           ._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8)
  ;
  if (0 < (int)(uVar6 + ((int)p_Var5 - (int)p_Var3) * 8)) {
    uVar10 = 0;
    do {
      if ((p_Var3[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0) {
        RankIndexToChar((int)uVar10);
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
        p_Var3 = (this->rank_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
        p_Var5 = (this->rank_).value_plausible_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
        uVar6 = *(uint *)((long)&(this->rank_).value_plausible_.
                                 super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8);
      }
      uVar9 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar9;
    } while ((int)uVar9 < (int)(uVar6 + ((int)p_Var5 - (int)p_Var3) * 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HanabiHand::CardKnowledge::ToString() const {
  std::string result;
  result = result + (ColorHinted() ? ColorIndexToChar(Color()) : 'X') +
           (RankHinted() ? RankIndexToChar(Rank()) : 'X') + '|';
  for (int c = 0; c < color_.Range(); ++c) {
    if (color_.IsPlausible(c)) {
      result += ColorIndexToChar(c);
    }
  }
  for (int r = 0; r < rank_.Range(); ++r) {
    if (rank_.IsPlausible(r)) {
      result += RankIndexToChar(r);
    }
  }
  return result;
}